

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O3

int CivetServer::webSocketDataHandler
              (mg_connection *conn,int bits,char *data,size_t data_len,void *cbdata)

{
  byte bVar1;
  uint uVar2;
  mg_request_info *pmVar3;
  
  pmVar3 = mg_get_request_info(conn);
  if (*(long *)((long)pmVar3->user_data + 8) == 0) {
    uVar2 = 0;
  }
  else if (cbdata == (void *)0x0) {
    uVar2 = 1;
  }
  else {
    bVar1 = (**(code **)(*cbdata + 0x20))(cbdata,pmVar3->user_data,conn,bits,data,data_len);
    uVar2 = (uint)bVar1;
  }
  return uVar2;
}

Assistant:

int
CivetServer::webSocketDataHandler(struct mg_connection *conn,
                                  int bits,
                                  char *data,
                                  size_t data_len,
                                  void *cbdata)
{
	const struct mg_request_info *request_info = mg_get_request_info(conn);
	assert(request_info != NULL);
	CivetServer *me = (CivetServer *)(request_info->user_data);
	assert(me != NULL);

	// Happens when a request hits the server before the context is saved
	if (me->context == NULL)
		return 0;

	CivetWebSocketHandler *handler = (CivetWebSocketHandler *)cbdata;

	if (handler) {
		return handler->handleData(me, conn, bits, data, data_len) ? 1 : 0;
	}

	return 1; // No handler found
}